

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::RoundEvenCase::compare(RoundEvenCase *this,void **inputs,void **outputs)

{
  float fVar1;
  Precision PVar2;
  pointer pSVar3;
  void *pvVar4;
  void *pvVar5;
  deUint32 aBits;
  uint uVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  uint uVar10;
  int iVar11;
  ostringstream *poVar12;
  float fVar13;
  ulong uVar14;
  deUint32 bBits;
  float fVar15;
  float fVar16;
  float fVar17;
  float __x;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  uVar6 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar2 - PRECISION_MEDIUMP < 2) {
    if ((int)uVar6 < 1) {
      return true;
    }
    pvVar4 = *inputs;
    pvVar5 = *outputs;
    uVar14 = 0;
    do {
      fVar13 = *(float *)((long)pvVar4 + uVar14 * 4);
      fVar16 = *(float *)((long)pvVar5 + uVar14 * 4);
      fVar15 = floorf(fVar13);
      fVar15 = fVar13 - fVar15;
      iVar7 = (int)(fVar13 - fVar15);
      if (fVar15 <= 0.5) {
        iVar7 = iVar7 + (uint)((byte)iVar7 & fVar15 == 0.5);
      }
      else {
        iVar7 = iVar7 + 1;
      }
      fVar15 = (float)iVar7;
      if (PVar2 == PRECISION_HIGHP) {
LAB_0149a420:
        fVar13 = (float)((int)fVar15 - (int)fVar16);
        if ((uint)fVar15 < (uint)fVar16) {
          fVar13 = (float)-((int)fVar15 - (int)fVar16);
        }
      }
      else if ((fVar16 != 0.0) || (NAN(fVar16))) {
        if (iVar7 != 0) goto LAB_0149a420;
        fVar13 = ABS(fVar16);
      }
      else {
        fVar13 = ABS(fVar15);
      }
      if (fVar13 != 0.0) {
        poVar12 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar12->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar9 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] = ",4);
        local_34.value = fVar15;
        poVar9 = Functional::operator<<(poVar9,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", got ULP diff ",0xf);
LAB_0149a72c:
        local_40.value._4_4_ = 0;
        local_40.value._0_4_ = fVar13;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar9);
        return false;
      }
      uVar14 = uVar14 + 1;
    } while (uVar6 != uVar14);
  }
  else {
    uVar10 = -1 << (0x17 - (&DAT_01c52c6c)[(ulong)PVar2 * 4] & 0x1f);
    if ((int)uVar6 < 1) {
      return true;
    }
    fVar13 = (float)~uVar10;
    fVar16 = (float)(uVar10 & 0x7fffff ^ 0x3fffffff) + -1.0;
    pvVar4 = *inputs;
    pvVar5 = *outputs;
    uVar14 = 0;
    do {
      fVar15 = *(float *)((long)pvVar4 + uVar14 * 4);
      fVar1 = *(float *)((long)pvVar5 + uVar14 * 4);
      __x = fVar15 - fVar16;
      fVar17 = floorf(__x);
      fVar17 = __x - fVar17;
      iVar7 = (int)(__x - fVar17);
      if (fVar17 <= 0.5) {
        iVar7 = iVar7 + (uint)((byte)iVar7 & fVar17 == 0.5);
      }
      else {
        iVar7 = iVar7 + 1;
      }
      fVar15 = fVar15 + fVar16;
      fVar17 = floorf(fVar15);
      fVar17 = fVar15 - fVar17;
      iVar8 = (int)(fVar15 - fVar17);
      if (fVar17 <= 0.5) {
        iVar8 = iVar8 + (uint)((byte)iVar8 & fVar17 == 0.5);
      }
      else {
        iVar8 = iVar8 + 1;
      }
      iVar7 = (int)(float)iVar7;
      iVar8 = (int)(float)iVar8;
      if (iVar8 < iVar7) {
LAB_0149a615:
        poVar12 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar12->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar9 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] = [",5);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] with ULP threshold ",0x15);
        goto LAB_0149a72c;
      }
      iVar11 = iVar7;
      while( true ) {
        fVar15 = (float)iVar11;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          fVar17 = ABS(fVar1);
          if (iVar11 != 0) {
            fVar17 = (float)((int)fVar15 - (int)fVar1);
            if ((uint)fVar15 < (uint)fVar1) {
              fVar17 = (float)-((int)fVar15 - (int)fVar1);
            }
          }
        }
        else {
          fVar17 = ABS(fVar15);
        }
        if ((uint)fVar17 <= (uint)fVar13) break;
        iVar11 = iVar11 + 1;
        if (iVar8 < iVar11) goto LAB_0149a615;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar6);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasSignedZero	= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact rounding result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= roundEven(in0);

				const deUint32	ulpDiff		= hasSignedZero ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(roundEven(in0-eps));
				const int		maxRes		= int(roundEven(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}